

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_pcm_deinterleave_s16(void **dst,void *src,ma_uint64 frameCount,ma_uint32 channels)

{
  ma_int16 *src_s16;
  ma_uint64 mVar1;
  ma_uint32 iChannel;
  ulong uVar2;
  
  for (mVar1 = 0; mVar1 != frameCount; mVar1 = mVar1 + 1) {
    for (uVar2 = 0; channels != uVar2; uVar2 = uVar2 + 1) {
      *(undefined2 *)((long)dst[uVar2] + mVar1 * 2) = *(undefined2 *)((long)src + uVar2 * 2);
    }
    src = (void *)((long)src + (ulong)channels * 2);
  }
  return;
}

Assistant:

MA_API void ma_pcm_deinterleave_s16(void** dst, const void* src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_deinterleave_s16__reference(dst, src, frameCount, channels);
#else
    ma_pcm_deinterleave_s16__optimized(dst, src, frameCount, channels);
#endif
}